

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

bool __thiscall
UnscentedKalmanFilter::GenerateAugmentedSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig_aug)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  DenseIndex DVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  range_error *this_00;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  char *pcVar13;
  long lVar14;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m;
  ulong uVar15;
  double *pdVar16;
  Index col;
  ulong uVar17;
  Index inner;
  long lVar18;
  double *pdVar19;
  Index row;
  long lVar20;
  ulong uVar21;
  Index index_4;
  Index size;
  long lVar22;
  ulong uVar23;
  Index index_6;
  VectorXd x_aug;
  MatrixXd P_aug;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> lltOfPaug;
  MatrixXd L;
  DenseStorage<double,__1,__1,_1,_0> local_178;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_150;
  UnscentedKalmanFilter *local_148;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_140;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_120;
  undefined1 local_118 [40];
  bool local_f0;
  
  DVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar22 = (long)this->n_aug_;
  local_150 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_aug;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_178,lVar22,lVar22,1);
  if (lVar22 < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  lVar22 = (long)this->n_aug_;
  if (lVar22 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,lVar22 * lVar22,lVar22,lVar22);
  iVar10 = (int)DVar5;
  uVar23 = (ulong)iVar10;
  if ((long)uVar23 < 0 && local_178.m_data != (double *)0x0) {
    pcVar13 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
    ;
LAB_0011c5bf:
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                  ,0x94,pcVar13);
  }
  if ((-1 < (long)uVar23) && ((long)uVar23 <= local_178.m_rows)) {
    if (uVar23 == (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
      uVar11 = (ulong)((uint)((ulong)local_178.m_data >> 3) & 1);
      if (uVar23 <= uVar11) {
        uVar11 = uVar23;
      }
      if (((ulong)local_178.m_data & 7) != 0) {
        uVar11 = uVar23;
      }
      uVar15 = uVar23 - uVar11;
      if (uVar11 != 0) {
        pdVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        uVar17 = 0;
        do {
          local_178.m_data[uVar17] = pdVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      uVar17 = uVar11 + (long)((int)(((uint)(uVar15 >> 0x1f) & 1) + (int)uVar15) >> 1) * 2;
      if (1 < (long)uVar15) {
        do {
          pdVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + uVar11;
          dVar6 = pdVar12[1];
          local_178.m_data[uVar11] = *pdVar12;
          (local_178.m_data + uVar11)[1] = dVar6;
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar23) {
        pdVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        do {
          local_178.m_data[uVar17] = pdVar12[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar23 != uVar17);
      }
      iVar4 = this->n_aug_;
      uVar11 = uVar23;
      if (iVar10 < iVar4) {
        do {
          if ((iVar10 < 0) || (local_178.m_rows <= (long)uVar11)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_178.m_data[uVar11] = 0.0;
          uVar11 = uVar11 + 1;
        } while ((long)iVar4 != uVar11);
      }
      local_118._0_8_ = local_168.m_rows;
      local_118._8_8_ = local_168.m_cols;
      local_118._16_8_ = 0;
      if ((local_168.m_cols | local_168.m_rows) < 0) {
        __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x3f,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_168,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_118);
      m = local_150;
      if ((local_168.m_rows < (long)uVar23) || (local_168.m_cols < (long)uVar23)) {
        pcVar13 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_0011c74f;
      }
      if ((uVar23 == (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_rows) &&
         (uVar23 == (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_cols)) {
        if (0 < (long)uVar23) {
          uVar11 = (ulong)((uint)((ulong)local_168.m_data >> 3) & 1);
          if (((ulong)local_168.m_data & 7) != 0) {
            uVar11 = uVar23;
          }
          lVar22 = 0;
          uVar15 = 0;
          pdVar12 = local_168.m_data;
          do {
            if (0 < (long)uVar11) {
              lVar18 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
              pdVar16 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data;
              uVar17 = 0;
              do {
                pdVar12[uVar17] = *(double *)((long)pdVar16 + uVar17 * 8 + lVar18 * lVar22);
                uVar17 = uVar17 + 1;
              } while (uVar11 != uVar17);
            }
            uVar21 = uVar23 - uVar11 & 0xfffffffffffffffe;
            lVar18 = uVar21 + uVar11;
            uVar17 = uVar11;
            if (0 < (long)uVar21) {
              do {
                pdVar16 = (double *)
                          ((long)(P->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data +
                          uVar17 * 8 +
                          (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_rows * lVar22);
                dVar6 = pdVar16[1];
                pdVar12[uVar17] = *pdVar16;
                (pdVar12 + uVar17)[1] = dVar6;
                uVar17 = uVar17 + 2;
              } while ((long)uVar17 < lVar18);
            }
            if (lVar18 < (long)uVar23) {
              lVar14 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
              pdVar16 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data;
              do {
                pdVar12[lVar18] = *(double *)((long)pdVar16 + lVar18 * 8 + lVar14 * lVar22);
                lVar18 = lVar18 + 1;
              } while (lVar18 < (long)uVar23);
            }
            uVar11 = (long)(uVar11 + ((uint)local_168.m_rows & 1)) % 2;
            if ((long)uVar23 < (long)uVar11) {
              uVar11 = uVar23;
            }
            uVar15 = uVar15 + 1;
            pdVar12 = pdVar12 + local_168.m_rows;
            lVar22 = lVar22 + 8;
          } while (uVar15 != uVar23);
        }
        iVar10 = this->n_aug_;
        lVar22 = (long)iVar10;
        if (((1 < lVar22) && (lVar18 = lVar22 + -2, lVar18 < local_168.m_rows)) &&
           (lVar18 < local_168.m_cols)) {
          local_168.m_data[lVar18 * local_168.m_rows + lVar22 + -2] = this->std_a_ * this->std_a_;
          pdVar12 = (double *)(ulong)(iVar10 - 1);
          if ((pdVar12 < (ulong)local_168.m_rows) && (pdVar12 < (ulong)local_168.m_cols)) {
            local_168.m_data[(long)(local_168.m_rows * (long)pdVar12 + (long)pdVar12)] =
                 this->std_yawdd_ * this->std_yawdd_;
            Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
                      (&local_140,(MatrixType *)&local_168);
            if (local_140.m_isInitialized == false) {
              __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Cholesky/LLT.h"
                            ,0xa6,
                            "ComputationInfo Eigen::LLT<Eigen::Matrix<double, -1, -1>>::info() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                           );
            }
            if (local_140.m_info == NumericalIssue) {
              if (this->debug_ != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"LLT failed!",0xb);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                          ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118,
                           (MatrixType *)&local_168,true);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_aug:",6)
                ;
                poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                           &local_168);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Eigenvalues of P_aug:",0x15);
                poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (local_f0 == false) {
                  __assert_fail("m_isInitialized && \"EigenSolver is not initialized.\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Eigenvalues/EigenSolver.h"
                                ,0xf5,
                                "const EigenvalueType &Eigen::EigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                               );
                }
                poVar9 = Eigen::operator<<(poVar9,(
                                                  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                                                  *)(local_118 + 0x18));
                std::endl<char,std::char_traits<char>>(poVar9);
                Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver
                          ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118);
              }
              this_00 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_00,"LLT failed");
              __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
            }
            local_120 = &local_140;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_118,
                       (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                        *)&local_120);
            uVar23 = *(ulong *)m;
            pdVar12 = *(double **)(m + 8);
            if ((long)pdVar12 < 0 && uVar23 != 0) {
LAB_0011c5aa:
              pcVar13 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
              ;
              goto LAB_0011c5bf;
            }
            if ((long)*(ulong *)(m + 0x10) < 1) {
LAB_0011c5c9:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (pdVar12 == (double *)local_178.m_rows) {
              pdVar16 = (double *)(ulong)((uint)(uVar23 >> 3) & 1);
              if ((long)pdVar12 <= (long)pdVar16) {
                pdVar16 = pdVar12;
              }
              if ((uVar23 & 7) != 0) {
                pdVar16 = pdVar12;
              }
              lVar22 = (long)pdVar12 - (long)pdVar16;
              if (0 < (long)pdVar16) {
                pdVar19 = (double *)0x0;
                do {
                  *(double *)(uVar23 + (long)pdVar19 * 8) = local_178.m_data[(long)pdVar19];
                  pdVar19 = (double *)((long)pdVar19 + 1);
                } while (pdVar16 != pdVar19);
              }
              pdVar19 = (double *)
                        ((lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar16);
              if (1 < lVar22) {
                do {
                  dVar6 = (local_178.m_data + (long)pdVar16)[1];
                  pdVar2 = (double *)(uVar23 + (long)pdVar16 * 8);
                  *pdVar2 = local_178.m_data[(long)pdVar16];
                  pdVar2[1] = dVar6;
                  pdVar16 = (double *)((long)pdVar16 + 2);
                } while ((long)pdVar16 < (long)pdVar19);
              }
              if ((long)pdVar19 < (long)pdVar12) {
                do {
                  *(double *)(uVar23 + (long)pdVar19 * 8) = local_178.m_data[(long)pdVar19];
                  pdVar19 = (double *)((long)pdVar19 + 1);
                } while (pdVar12 != pdVar19);
              }
              dVar6 = (double)this->n_aug_ + this->lambda_;
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              uVar23 = (ulong)(uint)this->n_aug_;
              if (0 < this->n_aug_) {
                lVar18 = 8;
                iVar10 = 1;
                lVar14 = 0;
                lVar22 = 0;
                do {
                  local_148 = this;
                  if (((long)local_118._8_8_ < 0) &&
                     ((double *)(local_118._0_8_ + local_118._8_8_ * lVar22 * 8) != (double *)0x0))
                  goto LAB_0011c5aa;
                  if ((long)local_118._16_8_ <= lVar22) goto LAB_0011c5c9;
                  if (local_178.m_rows != local_118._8_8_) {
                    pcVar13 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
                    ;
LAB_0011c64a:
                    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                                  ,0x84,pcVar13);
                  }
                  lVar1 = lVar22 + 1;
                  uVar11 = *(ulong *)m;
                  pdVar12 = *(double **)(m + 8);
                  uVar15 = (long)pdVar12 * lVar1 * 8 + uVar11;
                  if ((long)pdVar12 < 0 && uVar15 != 0) goto LAB_0011c5aa;
                  if ((long)*(ulong *)(m + 0x10) <= lVar1) goto LAB_0011c5c9;
                  if (pdVar12 != (double *)local_118._8_8_) {
                    pcVar13 = 
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
                    ;
                    goto LAB_0011c62b;
                  }
                  pdVar16 = (double *)(ulong)((uint)(uVar15 >> 3) & 1);
                  if ((long)local_118._8_8_ <= (long)pdVar16) {
                    pdVar16 = (double *)local_118._8_8_;
                  }
                  if ((uVar15 & 7) != 0) {
                    pdVar16 = (double *)local_118._8_8_;
                  }
                  if (0 < (long)pdVar16) {
                    pdVar19 = (double *)0x0;
                    do {
                      *(double *)((long)pdVar12 * lVar18 + uVar11 + (long)pdVar19 * 8) =
                           *(double *)
                            (local_118._0_8_ + (long)pdVar19 * 8 + local_118._8_8_ * lVar14) * dVar6
                           + local_178.m_data[(long)pdVar19];
                      pdVar19 = (double *)((long)pdVar19 + 1);
                    } while (pdVar16 != pdVar19);
                  }
                  lVar20 = local_118._8_8_ - (long)pdVar16;
                  pdVar19 = (double *)
                            ((lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar16);
                  if (1 < lVar20) {
                    do {
                      dVar7 = (local_178.m_data + (long)pdVar16)[1];
                      pdVar2 = (double *)
                               (local_118._0_8_ + (long)pdVar16 * 8 + local_118._8_8_ * lVar14);
                      dVar8 = pdVar2[1];
                      pdVar3 = (double *)((long)pdVar12 * lVar18 + uVar11 + (long)pdVar16 * 8);
                      *pdVar3 = *pdVar2 * dVar6 + local_178.m_data[(long)pdVar16];
                      pdVar3[1] = dVar8 * dVar6 + dVar7;
                      pdVar16 = (double *)((long)pdVar16 + 2);
                    } while ((long)pdVar16 < (long)pdVar19);
                  }
                  if ((long)pdVar19 < (long)local_118._8_8_) {
                    do {
                      *(double *)(uVar11 + (long)pdVar12 * lVar18 + (long)pdVar19 * 8) =
                           *(double *)
                            (local_118._0_8_ + (long)pdVar19 * 8 + local_118._8_8_ * lVar14) * dVar6
                           + local_178.m_data[(long)pdVar19];
                      pdVar19 = (double *)((long)pdVar19 + 1);
                    } while ((double *)local_118._8_8_ != pdVar19);
                  }
                  if (((long)local_118._8_8_ < 0) &&
                     ((double *)(local_118._0_8_ + local_118._8_8_ * lVar22 * 8) != (double *)0x0))
                  goto LAB_0011c5aa;
                  if ((long)local_118._16_8_ <= lVar22) goto LAB_0011c5c9;
                  if (local_178.m_rows != local_118._8_8_) {
                    pcVar13 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
                    ;
                    goto LAB_0011c64a;
                  }
                  iVar4 = (int)uVar23;
                  lVar22 = (long)(iVar4 + (int)lVar1);
                  uVar11 = *(ulong *)local_150;
                  pdVar12 = *(double **)(local_150 + 8);
                  uVar23 = uVar11 + (long)pdVar12 * lVar22 * 8;
                  if (((long)pdVar12 < 0) && (uVar23 != 0)) goto LAB_0011c5aa;
                  if ((long)*(ulong *)(local_150 + 0x10) <= lVar22) goto LAB_0011c5c9;
                  if (pdVar12 != (double *)local_118._8_8_) {
                    pcVar13 = 
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
                    ;
                    goto LAB_0011c62b;
                  }
                  pdVar16 = (double *)(ulong)((uint)(uVar23 >> 3) & 1);
                  if ((long)local_118._8_8_ <= (long)pdVar16) {
                    pdVar16 = (double *)local_118._8_8_;
                  }
                  if ((uVar23 & 7) != 0) {
                    pdVar16 = (double *)local_118._8_8_;
                  }
                  if (0 < (long)pdVar16) {
                    pdVar19 = (double *)0x0;
                    do {
                      *(double *)
                       (uVar11 + (long)(iVar4 + iVar10) * (long)pdVar12 * 8 + (long)pdVar19 * 8) =
                           local_178.m_data[(long)pdVar19] -
                           *(double *)
                            (local_118._0_8_ + (long)pdVar19 * 8 + local_118._8_8_ * lVar14) * dVar6
                      ;
                      pdVar19 = (double *)((long)pdVar19 + 1);
                    } while (pdVar16 != pdVar19);
                  }
                  lVar22 = local_118._8_8_ - (long)pdVar16;
                  pdVar19 = (double *)
                            ((lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + (long)pdVar16);
                  if (1 < lVar22) {
                    do {
                      dVar7 = (local_178.m_data + (long)pdVar16)[1];
                      pdVar2 = (double *)
                               (local_118._0_8_ + (long)pdVar16 * 8 + local_118._8_8_ * lVar14);
                      dVar8 = pdVar2[1];
                      pdVar3 = (double *)
                               (uVar11 + (long)(iVar4 + iVar10) * (long)pdVar12 * 8 +
                               (long)pdVar16 * 8);
                      *pdVar3 = local_178.m_data[(long)pdVar16] - *pdVar2 * dVar6;
                      pdVar3[1] = dVar7 - dVar8 * dVar6;
                      pdVar16 = (double *)((long)pdVar16 + 2);
                    } while ((long)pdVar16 < (long)pdVar19);
                  }
                  if ((long)pdVar19 < (long)local_118._8_8_) {
                    do {
                      *(double *)
                       (uVar11 + (long)pdVar12 * (long)(iVar4 + iVar10) * 8 + (long)pdVar19 * 8) =
                           local_178.m_data[(long)pdVar19] -
                           *(double *)
                            (local_118._0_8_ + (long)pdVar19 * 8 + local_118._8_8_ * lVar14) * dVar6
                      ;
                      pdVar19 = (double *)((long)pdVar19 + 1);
                    } while ((double *)local_118._8_8_ != pdVar19);
                  }
                  uVar23 = (ulong)this->n_aug_;
                  lVar18 = lVar18 + 8;
                  lVar14 = lVar14 + 8;
                  iVar10 = iVar10 + 1;
                  m = local_150;
                  lVar22 = lVar1;
                } while (lVar1 < (long)uVar23);
              }
              if (2 < this->debug_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"L:\n",3);
                poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                           local_118);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Xsig_aug:\n",10);
                poVar9 = Eigen::operator<<((ostream *)&std::cout,m);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
              }
              free((void *)local_118._0_8_);
              free(local_140.m_matrix.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                  );
              free(local_168.m_data);
              free(local_178.m_data);
              return true;
            }
            pcVar13 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_0011c62b;
          }
        }
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pcVar13 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
      ;
    }
    else {
      pcVar13 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
LAB_0011c62b:
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,pcVar13);
  }
  pcVar13 = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0011c74f:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                ,0x8d,pcVar13);
}

Assistant:

bool UnscentedKalmanFilter::GenerateAugmentedSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig_aug) const {

    bool ret = true;
    int n_x = x.rows();
    
    // create augmented mean vector
    VectorXd x_aug(n_aug_);
  
    // create augmented state covariance
    MatrixXd P_aug(n_aug_, n_aug_);

    // create augmented mean state
    x_aug.head(n_x) = x;
    for (int i=n_x; i<n_aug_; i++)
	    x_aug(i) = 0.0;

    // create augmented covariance matrix
    P_aug.fill(0.0);
    P_aug.topLeftCorner(n_x,n_x) = P;
    P_aug(n_aug_-2,n_aug_-2) = std_a_*std_a_;
    P_aug(n_aug_-1,n_aug_-1) = std_yawdd_*std_yawdd_;
 
    // Take matrix square root
    // 1. compute the Cholesky decomposition of P_aug
    Eigen::LLT<MatrixXd> lltOfPaug(P_aug); 
    if (lltOfPaug.info() == Eigen::NumericalIssue) {
	// if decomposition fails, we have numerical issues
        if (debug_) {
	    std::cout << "LLT failed!" << std::endl;
	    Eigen::EigenSolver<MatrixXd> es(P_aug);
	    cout << "P_aug:" << P_aug << endl;
	    cout << "Eigenvalues of P_aug:" << endl << es.eigenvalues() << endl;
	}
	throw std::range_error("LLT failed");
    }
    // 2. get the lower triangle
    MatrixXd L = lltOfPaug.matrixL(); 

    Xsig_aug.col(0) = x_aug;
        
    double s = sqrt(lambda_+n_aug_);

    for (int i=0; i<n_aug_; i++) {
	int j = i+1;
	int k = j+n_aug_;
        Xsig_aug.col(j) = x_aug + s * L.col(i);
        Xsig_aug.col(k) = x_aug - s * L.col(i);
    }

    if (debug_ > 2) {
        std::cout << "L:\n" << L << std::endl;
        std::cout << "Xsig_aug:\n" << Xsig_aug << std::endl;
    }
    return ret;
}